

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CategoricalMapping::CategoricalMapping
          (CategoricalMapping *this,CategoricalMapping *from)

{
  MappingTypeCase MVar1;
  ValueOnUnknownCase VVar2;
  InternalMetadataWithArenaLite *this_00;
  StringToInt64Map *this_01;
  StringToInt64Map *from_00;
  Int64ToStringMap *this_02;
  Int64ToStringMap *from_01;
  string *value;
  int64 value_00;
  CategoricalMapping *from_local;
  CategoricalMapping *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__CategoricalMapping_00630db0;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  MappingTypeUnion::MappingTypeUnion((MappingTypeUnion *)&this->MappingType_);
  ValueOnUnknownUnion::ValueOnUnknownUnion
            ((ValueOnUnknownUnion *)&(this->ValueOnUnknown_).strvalue_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  clear_has_MappingType(this);
  MVar1 = MappingType_case(from);
  if (MVar1 != MAPPINGTYPE_NOT_SET) {
    if (MVar1 == kStringToInt64Map) {
      this_01 = mutable_stringtoint64map(this);
      from_00 = stringtoint64map(from);
      StringToInt64Map::MergeFrom(this_01,from_00);
    }
    else if (MVar1 == kInt64ToStringMap) {
      this_02 = mutable_int64tostringmap(this);
      from_01 = int64tostringmap(from);
      Int64ToStringMap::MergeFrom(this_02,from_01);
    }
  }
  clear_has_ValueOnUnknown(this);
  VVar2 = ValueOnUnknown_case(from);
  if (VVar2 != VALUEONUNKNOWN_NOT_SET) {
    if (VVar2 == kStrValue) {
      value = strvalue_abi_cxx11_(from);
      set_strvalue(this,value);
    }
    else if (VVar2 == kInt64Value) {
      value_00 = int64value(from);
      set_int64value(this,value_00);
    }
  }
  return;
}

Assistant:

CategoricalMapping::CategoricalMapping(const CategoricalMapping& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_MappingType();
  switch (from.MappingType_case()) {
    case kStringToInt64Map: {
      mutable_stringtoint64map()->::CoreML::Specification::StringToInt64Map::MergeFrom(from.stringtoint64map());
      break;
    }
    case kInt64ToStringMap: {
      mutable_int64tostringmap()->::CoreML::Specification::Int64ToStringMap::MergeFrom(from.int64tostringmap());
      break;
    }
    case MAPPINGTYPE_NOT_SET: {
      break;
    }
  }
  clear_has_ValueOnUnknown();
  switch (from.ValueOnUnknown_case()) {
    case kStrValue: {
      set_strvalue(from.strvalue());
      break;
    }
    case kInt64Value: {
      set_int64value(from.int64value());
      break;
    }
    case VALUEONUNKNOWN_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CategoricalMapping)
}